

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * LoadImageFromMemory(Image *__return_storage_ptr__,char *fileType,uchar *fileData,
                           int dataSize)

{
  Image image;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Bool _Var5;
  char *__src;
  stbi_uc *psVar6;
  float *pfVar7;
  Image *pIVar8;
  Image local_58;
  int local_40;
  int local_3c;
  int comp_1;
  int comp;
  char fileExtLower [16];
  int dataSize_local;
  uchar *fileData_local;
  char *fileType_local;
  
  pIVar8 = __return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  memset(&comp_1,0,0x10);
  __src = TextToLower(fileType);
  strcpy((char *)&comp_1,__src);
  _Var5 = TextIsEqual((char *)&comp_1,".png");
  if ((_Var5) || (_Var5 = TextIsEqual((char *)&comp_1,".gif"), _Var5)) {
    if (fileData != (uchar *)0x0) {
      local_3c = 0;
      psVar6 = stbi_load_from_memory(fileData,dataSize,&pIVar8->width,&pIVar8->height,&local_3c,0);
      pIVar8->data = psVar6;
      pIVar8->mipmaps = 1;
      if (local_3c == 1) {
        pIVar8->format = 1;
      }
      else if (local_3c == 2) {
        pIVar8->format = 2;
      }
      else if (local_3c == 3) {
        pIVar8->format = 4;
      }
      else if (local_3c == 4) {
        pIVar8->format = 7;
      }
    }
  }
  else {
    _Var5 = TextIsEqual((char *)&comp_1,".hdr");
    if (_Var5) {
      if (fileData != (uchar *)0x0) {
        local_40 = 0;
        pfVar7 = stbi_loadf_from_memory
                           (fileData,dataSize,&pIVar8->width,&pIVar8->height,&local_40,0);
        pIVar8->data = pfVar7;
        pIVar8->mipmaps = 1;
        if (local_40 == 1) {
          pIVar8->format = 8;
        }
        else if (local_40 == 3) {
          pIVar8->format = 9;
        }
        else if (local_40 == 4) {
          pIVar8->format = 10;
        }
        else {
          TraceLog(4,"IMAGE: HDR file format not supported");
          uVar1 = pIVar8->width;
          uVar2 = pIVar8->height;
          uVar3 = pIVar8->mipmaps;
          uVar4 = pIVar8->format;
          image.height = uVar4;
          image.width = uVar3;
          image.data._4_4_ = uVar2;
          image.data._0_4_ = uVar1;
          image._16_8_ = pIVar8;
          UnloadImage(image);
        }
      }
    }
    else {
      _Var5 = TextIsEqual((char *)&comp_1,".dds");
      if (_Var5) {
        LoadDDS(&local_58,fileData,dataSize);
        pIVar8->data = local_58.data;
        pIVar8->width = local_58.width;
        pIVar8->height = local_58.height;
        pIVar8->mipmaps = local_58.mipmaps;
        pIVar8->format = local_58.format;
      }
      else {
        TraceLog(4,"IMAGE: File format not supported");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageFromMemory(const char *fileType, const unsigned char *fileData, int dataSize)
{
    Image image = { 0 };

    char fileExtLower[16] = { 0 };
    strcpy(fileExtLower, TextToLower(fileType));

#if defined(SUPPORT_FILEFORMAT_PNG)
    if ((TextIsEqual(fileExtLower, ".png"))
#else
    if ((false)
#endif
#if defined(SUPPORT_FILEFORMAT_BMP)
        || (TextIsEqual(fileExtLower, ".bmp"))
#endif
#if defined(SUPPORT_FILEFORMAT_TGA)
        || (TextIsEqual(fileExtLower, ".tga"))
#endif
#if defined(SUPPORT_FILEFORMAT_JPG)
        || (TextIsEqual(fileExtLower, ".jpg") ||
            TextIsEqual(fileExtLower, ".jpeg"))
#endif
#if defined(SUPPORT_FILEFORMAT_GIF)
        || (TextIsEqual(fileExtLower, ".gif"))
#endif
#if defined(SUPPORT_FILEFORMAT_PIC)
        || (TextIsEqual(fileExtLower, ".pic"))
#endif
#if defined(SUPPORT_FILEFORMAT_PSD)
        || (TextIsEqual(fileExtLower, ".psd"))
#endif
       )
    {
#if defined(STBI_REQUIRED)
        // NOTE: Using stb_image to load images (Supports multiple image formats)

        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_load_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
            else if (comp == 2) image.format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
        }
#endif
    }
#if defined(SUPPORT_FILEFORMAT_HDR)
    else if (TextIsEqual(fileExtLower, ".hdr"))
    {
#if defined(STBI_REQUIRED)
        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_loadf_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_R32;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32A32;
            else
            {
                TRACELOG(LOG_WARNING, "IMAGE: HDR file format not supported");
                UnloadImage(image);
            }
        }
#endif
    }
#endif
#if defined(SUPPORT_FILEFORMAT_DDS)
    else if (TextIsEqual(fileExtLower, ".dds")) image = LoadDDS(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PKM)
    else if (TextIsEqual(fileExtLower, ".pkm")) image = LoadPKM(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_KTX)
    else if (TextIsEqual(fileExtLower, ".ktx")) image = LoadKTX(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PVR)
    else if (TextIsEqual(fileExtLower, ".pvr")) image = LoadPVR(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_ASTC)
    else if (TextIsEqual(fileExtLower, ".astc")) image = LoadASTC(fileData, dataSize);
#endif
    else TRACELOG(LOG_WARNING, "IMAGE: File format not supported");

    return image;
}